

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

FState * __thiscall AWeapon::GetDownState(AWeapon *this)

{
  uint uVar1;
  MetaClass *pMVar2;
  VMFunction **ppVVar3;
  VMFrameStack *this_00;
  VMValue *local_80;
  VMFunction *local_78;
  AWeapon *local_68;
  FState *retval;
  VMReturn ret;
  undefined1 local_38 [8];
  VMValue params [1];
  VMFunction *func;
  MetaClass *clss;
  AWeapon *this_local;
  
  if ((GetDownState::VIndex == 0xffffffff) &&
     (GetDownState::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"GetDownState"),
     GetDownState::VIndex == 0xffffffff)) {
    __assert_fail("VIndex != ~0u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x363,"FState *AWeapon::GetDownState()");
  }
  pMVar2 = GetClass(this);
  uVar1 = TArray<VMFunction_*,_VMFunction_*>::Size
                    (&(pMVar2->super_PClassInventory).super_PClassActor.super_PClass.Virtuals);
  if (GetDownState::VIndex < uVar1) {
    ppVVar3 = TArray<VMFunction_*,_VMFunction_*>::operator[]
                        (&(pMVar2->super_PClassInventory).super_PClassActor.super_PClass.Virtuals,
                         (ulong)GetDownState::VIndex);
    local_78 = *ppVVar3;
  }
  else {
    local_78 = (VMFunction *)0x0;
  }
  params[0].field_0._8_8_ = local_78;
  if (local_78 == (VMFunction *)0x0) {
    this_local = (AWeapon *)0x0;
  }
  else {
    VMValue::VMValue((VMValue *)local_38,(DObject *)this);
    VMReturn::PointerAt((VMReturn *)&retval,&local_68);
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,(VMFunction *)params[0].field_0._8_8_,(VMValue *)local_38,1,
                       (VMReturn *)&retval,1,(VMException **)0x0);
    this_local = local_68;
    local_80 = (VMValue *)((long)&params[0].field_0 + 8);
    do {
      local_80 = local_80 + -1;
      VMValue::~VMValue(local_80);
    } while (local_80 != (VMValue *)local_38);
  }
  return (FState *)this_local;
}

Assistant:

FState *AWeapon::GetDownState ()
{
	IFVIRTUAL(AWeapon, GetDownState)
	{
		VMValue params[1] = { (DObject*)this };
		VMReturn ret;
		FState *retval;
		ret.PointerAt((void**)&retval);
		GlobalVMStack.Call(func, params, 1, &ret, 1, nullptr);
		return retval;
	}
	return nullptr;
}